

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gl4cGPUShaderFP64Tests.cpp
# Opt level: O0

void __thiscall
gl4cts::FunctionObject::
binary<tcu::Matrix<double,_4,_4>,_tcu::Vector<double,_4>,_tcu::Vector<double,_4>_>::call
          (binary<tcu::Matrix<double,_4,_4>,_tcu::Vector<double,_4>,_tcu::Vector<double,_4>_> *this,
          GLvoid *result_dst,GLvoid *argument_src)

{
  double *this_00;
  double *this_01;
  code *pcVar1;
  GLuint GVar2;
  Matrix<double,_4,_4> local_170;
  undefined1 local_f0 [8];
  Matrix<double,_4,_4> result;
  Vector<double,_4> arg_2;
  Vector<double,_4> arg_1;
  functionPointer p_function;
  GLuint argument_1_stride;
  GLvoid *argument_src_local;
  GLvoid *result_dst_local;
  binary<tcu::Matrix<double,_4,_4>,_tcu::Vector<double,_4>,_tcu::Vector<double,_4>_> *this_local;
  
  GVar2 = GPUShaderFP64Test10::functionObject::getArgumentStride((functionObject *)this,0);
  pcVar1 = (code *)(this->super_binaryBase).super_functionObject.m_p_function;
  this_00 = arg_2.m_data + 3;
  tcu::Vector<double,_4>::Vector((Vector<double,_4> *)this_00);
  this_01 = result.m_data.m_data[3].m_data + 3;
  tcu::Vector<double,_4>::Vector((Vector<double,_4> *)this_01);
  tcu::Matrix<double,_4,_4>::Matrix((Matrix<double,_4,_4> *)local_f0);
  unpack<tcu::Vector<double,_4>_>::get(argument_src,(Vector<double,_4> *)this_00);
  unpack<tcu::Vector<double,_4>_>::get
            ((GLvoid *)((long)argument_src + (ulong)GVar2),(Vector<double,_4> *)this_01);
  (*pcVar1)(&local_170,this_00,this_01);
  tcu::Matrix<double,_4,_4>::operator=((Matrix<double,_4,_4> *)local_f0,&local_170);
  tcu::Matrix<double,_4,_4>::~Matrix(&local_170);
  pack<tcu::Matrix<double,_4,_4>_>::set(result_dst,(Matrix<double,_4,_4> *)local_f0);
  tcu::Matrix<double,_4,_4>::~Matrix((Matrix<double,_4,_4> *)local_f0);
  return;
}

Assistant:

virtual void call(glw::GLvoid* result_dst, const glw::GLvoid* argument_src) const
	{
		const glw::GLuint argument_1_stride = getArgumentStride(0);

		functionPointer p_function = (functionPointer)m_p_function;

		Arg1T arg_1;
		Arg2T arg_2;
		ResT  result;

		unpack<Arg1T>::get(argument_src, arg_1);
		unpack<Arg2T>::get((glw::GLubyte*)argument_src + argument_1_stride, arg_2);

		result = p_function(arg_1, arg_2);

		pack<ResT>::set(result_dst, result);
	}